

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceReleaseQueue.hpp
# Opt level: O2

void __thiscall
Diligent::ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::ResourceReleaseQueue
          (ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *this,
          IMemoryAllocator *Allocator)

{
  allocator_type local_50;
  
  *(undefined8 *)((long)&(this->m_ReleaseQueueMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_ReleaseQueueMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_ReleaseQueueMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_ReleaseQueueMutex).super___mutex_base._M_mutex + 8) = 0;
  (this->m_ReleaseQueueMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  local_50.m_dvpDescription = "Allocator for deque<ReleaseQueueElemType>";
  local_50.m_dvpFileName =
       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/ResourceReleaseQueue.hpp"
  ;
  local_50.m_dvpLineNumber = 0xe6;
  local_50.m_Allocator = Allocator;
  std::
  deque<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::STDAllocator<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::IMemoryAllocator>_>
  ::deque(&this->m_ReleaseQueue,&local_50);
  *(undefined8 *)((long)&(this->m_StaleObjectsMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_StaleObjectsMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_StaleObjectsMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_StaleObjectsMutex).super___mutex_base._M_mutex + 8) = 0;
  (this->m_StaleObjectsMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  local_50.m_dvpDescription = "Allocator for deque<ReleaseQueueElemType>";
  local_50.m_dvpFileName =
       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/ResourceReleaseQueue.hpp"
  ;
  local_50.m_dvpLineNumber = 0xe7;
  local_50.m_Allocator = Allocator;
  std::
  deque<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::STDAllocator<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::IMemoryAllocator>_>
  ::deque(&this->m_StaleResources,&local_50);
  return;
}

Assistant:

ResourceReleaseQueue(IMemoryAllocator& Allocator) :
        m_ReleaseQueue  (STD_ALLOCATOR_RAW_MEM(ReleaseQueueElemType, Allocator, "Allocator for deque<ReleaseQueueElemType>")),
        m_StaleResources(STD_ALLOCATOR_RAW_MEM(ReleaseQueueElemType, Allocator, "Allocator for deque<ReleaseQueueElemType>"))
    {}